

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

bool __thiscall QSslSocketPrivate::verifyProtocolSupported(QSslSocketPrivate *this,char *where)

{
  QLatin1StringView t;
  QAbstractSocketPrivate *in_RSI;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView protocolName;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  SocketError errorCode;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *this_00;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  bool bVar1;
  char *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff98;
  QDebug local_40;
  QLatin1StringView local_38;
  QLatin1StringView local_28;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.m_data = (char *)0xaaaaaaaaaaaaaaaa;
  local_28.m_size = 0xaaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  local_28 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                        (size_t)in_RDI);
  errorCode = *(SocketError *)&in_RDI[0x32].category;
  if (errorCode == UnknownSocketError) {
    local_38 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(0xffffffff,in_stack_ffffffffffffff58),(size_t)in_RDI);
    local_28 = local_38;
  }
  else if (3 < (uint)(errorCode + ~NetworkError)) {
    bVar1 = true;
    goto LAB_003a0a0b;
  }
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QtPrivateLogging::lcSsl();
  anon_unknown.dwarf_a87c06::QLoggingCategoryMacroHolder<(QtMsgType)1>::QLoggingCategoryMacroHolder
            (in_RDI,(QLoggingCategory *)
                    CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  while( true ) {
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    if (!bVar1) break;
    anon_unknown.dwarf_a87c06::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3a0941);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_RSI,(char *)CONCAT44(errorCode,in_stack_ffffffffffffff58),
               (int)((ulong)in_RDI >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
               (char *)0x3a0957);
    QMessageLogger::warning();
    QDebug::operator<<((QDebug *)this_00,in_stack_ffffffffffffff98);
    QDebug::operator<<((QDebug *)this_00,in_stack_ffffffffffffff98);
    t.m_size._7_1_ = in_stack_ffffffffffffff77;
    t.m_size._0_7_ = in_stack_ffffffffffffff70;
    t.m_data = in_stack_ffffffffffffff78;
    in_stack_ffffffffffffff98 = local_28.m_data;
    QDebug::operator<<((QDebug *)this_00,t);
    QDebug::~QDebug(&local_40);
    local_10 = local_10 & 0xffffffffffffff00;
  }
  QSslSocket::tr((char *)CONCAT44(errorCode,in_stack_ffffffffffffff58),(char *)in_RDI,
                 in_stack_ffffffffffffff4c);
  QAbstractSocketPrivate::setErrorAndEmit(in_RSI,errorCode,(QString *)in_RDI);
  QString::~QString((QString *)0x3a09ff);
  bVar1 = false;
LAB_003a0a0b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QSslSocketPrivate::verifyProtocolSupported(const char *where)
{
    auto protocolName = "DTLS"_L1;
    switch (configuration.protocol) {
    case QSsl::UnknownProtocol:
        // UnknownProtocol, according to our docs, is for cipher whose protocol is unknown.
        // Should not be used when configuring QSslSocket.
        protocolName = "UnknownProtocol"_L1;
        Q_FALLTHROUGH();
QT_WARNING_PUSH
QT_WARNING_DISABLE_DEPRECATED
    case QSsl::DtlsV1_0:
    case QSsl::DtlsV1_2:
    case QSsl::DtlsV1_0OrLater:
    case QSsl::DtlsV1_2OrLater:
        qCWarning(lcSsl) << where << "QSslConfiguration with unexpected protocol" << protocolName;
        setErrorAndEmit(QAbstractSocket::SslInvalidUserDataError,
                        QSslSocket::tr("Attempted to use an unsupported protocol."));
        return false;
QT_WARNING_POP
    default:
        return true;
    }
}